

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall xLearn::DMatrix::AddRow(DMatrix *this)

{
  vector<float,_std::allocator<float>_> *in_RDI;
  value_type *in_stack_ffffffffffffffd8;
  
  std::vector<float,_std::allocator<float>_>::push_back
            (in_RDI,(value_type *)in_stack_ffffffffffffffd8);
  std::vector<float,_std::allocator<float>_>::push_back
            (in_RDI,(value_type *)in_stack_ffffffffffffffd8);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::push_back((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               *)in_RDI,in_stack_ffffffffffffffd8);
  *(int *)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage =
       *(int *)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
  return;
}

Assistant:

void AddRow() {
    this->Y.push_back(0);
    this->norm.push_back(1.0);
    this->row.push_back(nullptr);
    row_length++;
  }